

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::MILSpec::Block::SerializeWithCachedSizes
          (Block *this,CodedOutputStream *output)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  int iVar1;
  char *data;
  InnerMap *pIVar2;
  MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
  *pMVar3;
  value_type *pvVar4;
  scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*>
  sVar5;
  Type *value;
  Type *pTVar6;
  Type *value_00;
  MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
  **ppMVar7;
  ulong uVar8;
  MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  *pMVar9;
  int iVar10;
  long lVar11;
  MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  *pMVar12;
  MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  *pMVar13;
  long i;
  scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*>
  items;
  const_iterator it;
  scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*>
  local_68;
  iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>::KeyValuePair>
  local_60;
  iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>::KeyValuePair>
  local_48;
  
  iVar1 = (this->inputs_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar10 = 0;
    do {
      value = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::NamedValueType>::TypeHandler>
                        (&(this->inputs_).super_RepeatedPtrFieldBase,iVar10);
      google::protobuf::internal::WireFormatLite::WriteMessage(1,&value->super_MessageLite,output);
      iVar10 = iVar10 + 1;
    } while (iVar1 != iVar10);
  }
  iVar1 = (this->outputs_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar1) {
    this_00 = &this->outputs_;
    iVar10 = 0;
    do {
      pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,iVar10);
      data = (pTVar6->_M_dataplus)._M_p;
      pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,iVar10);
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                (data,(int)pTVar6->_M_string_length,SERIALIZE,
                 "CoreML.Specification.MILSpec.Block.outputs");
      pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,iVar10);
      google::protobuf::internal::WireFormatLite::WriteString(2,pTVar6,output);
      iVar10 = iVar10 + 1;
    } while (iVar1 != iVar10);
  }
  iVar1 = (this->operations_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar10 = 0;
    do {
      value_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::Operation>::TypeHandler>
                           (&(this->operations_).super_RepeatedPtrFieldBase,iVar10);
      google::protobuf::internal::WireFormatLite::WriteMessage
                (3,&value_00->super_MessageLite,output);
      iVar10 = iVar10 + 1;
    } while (iVar1 != iVar10);
  }
  pIVar2 = (this->attributes_).map_.elements_;
  if (pIVar2->num_elements_ != 0) {
    uVar8 = google::protobuf::io::CodedOutputStream::default_serialization_deterministic_;
    if (output->serialization_deterministic_is_overridden_ != false) {
      uVar8 = (ulong)output->serialization_deterministic_override_;
    }
    local_48.m_ = pIVar2;
    if ((pIVar2->num_elements_ == 1) || (uVar8 == 0)) {
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
      ::InnerMap::
      iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>::KeyValuePair>
      ::SearchFrom(&local_48,pIVar2->index_of_first_non_null_);
      local_60.node_ = (Node *)CONCAT44(local_48.node_._4_4_,local_48.node_._0_4_);
      local_60.m_ = local_48.m_;
      local_60.bucket_index_ = local_48.bucket_index_;
      pMVar13 = (MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
                 *)0x0;
      while (local_60.node_ != (Node *)0x0) {
        pvVar4 = ((local_60.node_)->kv).v_;
        pMVar9 = google::protobuf::internal::
                 MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
                 ::Wrap(&pvVar4->first,&pvVar4->second,(this->attributes_).arena_);
        pMVar12 = pMVar13;
        if ((pMVar13 != pMVar9) &&
           (pMVar12 = pMVar9,
           pMVar13 !=
           (MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
            *)0x0)) {
          (*(pMVar13->
            super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
            ).super_MessageLite._vptr_MessageLite[1])(pMVar13);
        }
        if (pMVar12 ==
            (MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
             *)0x0) goto LAB_002d9454;
        google::protobuf::internal::WireFormatLite::WriteMessage(4,(MessageLite *)pMVar12,output);
        pvVar4 = ((local_60.node_)->kv).v_;
        google::protobuf::internal::WireFormatLite::VerifyUtf8String
                  ((pvVar4->first)._M_dataplus._M_p,(int)(pvVar4->first)._M_string_length,SERIALIZE,
                   "CoreML.Specification.MILSpec.Block.AttributesEntry.key");
        google::protobuf::
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
        ::InnerMap::
        iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>::KeyValuePair>
        ::operator++(&local_60);
        pMVar13 = pMVar12;
      }
      if (pMVar13 !=
          (MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
           *)0x0) {
        (*(pMVar13->
          super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
          ).super_MessageLite._vptr_MessageLite[1])(pMVar13);
      }
    }
    else {
      local_68.array_ =
           (MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
            **)operator_new__(-(ulong)(pIVar2->num_elements_ >> 0x3d != 0) |
                              pIVar2->num_elements_ << 3);
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
      ::InnerMap::
      iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>::KeyValuePair>
      ::SearchFrom(&local_48,pIVar2->index_of_first_non_null_);
      local_60.node_ = (Node *)CONCAT44(local_48.node_._4_4_,local_48.node_._0_4_);
      local_60.m_ = local_48.m_;
      local_60.bucket_index_ = local_48.bucket_index_;
      i = 0;
      if (local_60.node_ != (Node *)0x0) {
        do {
          pMVar3 = ((local_60.node_)->kv).v_;
          ppMVar7 = google::protobuf::internal::
                    scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*>
                    ::operator[](&local_68,i);
          *ppMVar7 = pMVar3;
          google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
          ::InnerMap::
          iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>::KeyValuePair>
          ::operator++(&local_60);
          i = i + 1;
        } while (local_60.node_ != (Node *)0x0);
      }
      sVar5.array_ = local_68.array_;
      if (local_68.array_ ==
          (MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
           **)0x0) {
        __assert_fail("array_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                      ,0xb3,
                      "C &google::protobuf::internal::scoped_array<const google::protobuf::MapPair<std::basic_string<char>, CoreML::Specification::MILSpec::Value> *>::operator[](std::ptrdiff_t) const [C = const google::protobuf::MapPair<std::basic_string<char>, CoreML::Specification::MILSpec::Value> *]"
                     );
      }
      ppMVar7 = google::protobuf::internal::
                scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*>
                ::operator[](&local_68,i);
      if (sVar5.array_ != ppMVar7) {
        uVar8 = (long)ppMVar7 - (long)sVar5.array_ >> 3;
        lVar11 = 0x3f;
        if (uVar8 != 0) {
          for (; uVar8 >> lVar11 == 0; lVar11 = lVar11 + -1) {
          }
        }
        std::
        __introsort_loop<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Value>const**,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::CompareByDerefFirst<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Value>const*>>>
                  (sVar5.array_,ppMVar7,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Value>const**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::CompareByDerefFirst<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Value>const*>>>
                  (sVar5.array_,ppMVar7);
      }
      if (i == 0) {
        pMVar13 = (MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
                   *)0x0;
      }
      else {
        lVar11 = 0;
        pMVar12 = (MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
                   *)0x0;
        do {
          ppMVar7 = google::protobuf::internal::
                    scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*>
                    ::operator[](&local_68,lVar11);
          pMVar3 = *ppMVar7;
          ppMVar7 = google::protobuf::internal::
                    scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*>
                    ::operator[](&local_68,lVar11);
          pMVar9 = google::protobuf::internal::
                   MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
                   ::Wrap(&pMVar3->first,&(*ppMVar7)->second,(this->attributes_).arena_);
          pMVar13 = pMVar12;
          if ((pMVar12 != pMVar9) &&
             (pMVar13 = pMVar9,
             pMVar12 !=
             (MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
              *)0x0)) {
            (*(pMVar12->
              super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
              ).super_MessageLite._vptr_MessageLite[1])(pMVar12);
          }
          if (pMVar13 ==
              (MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
               *)0x0) {
LAB_002d9454:
            __assert_fail("ptr_ != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                          ,0x5b,
                          "C &google::protobuf::internal::scoped_ptr<google::protobuf::internal::MapEntryLite<std::basic_string<char>, CoreML::Specification::MILSpec::Value, google::protobuf::internal::WireFormatLite::TYPE_STRING, google::protobuf::internal::WireFormatLite::TYPE_MESSAGE, 0>>::operator*() const [C = google::protobuf::internal::MapEntryLite<std::basic_string<char>, CoreML::Specification::MILSpec::Value, google::protobuf::internal::WireFormatLite::TYPE_STRING, google::protobuf::internal::WireFormatLite::TYPE_MESSAGE, 0>]"
                         );
          }
          google::protobuf::internal::WireFormatLite::WriteMessage(4,(MessageLite *)pMVar13,output);
          ppMVar7 = google::protobuf::internal::
                    scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*>
                    ::operator[](&local_68,lVar11);
          google::protobuf::internal::WireFormatLite::VerifyUtf8String
                    (((*ppMVar7)->first)._M_dataplus._M_p,(int)((*ppMVar7)->first)._M_string_length,
                     SERIALIZE,"CoreML.Specification.MILSpec.Block.AttributesEntry.key");
          lVar11 = lVar11 + 1;
          pMVar12 = pMVar13;
        } while (i != lVar11);
      }
      if (pMVar13 !=
          (MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
           *)0x0) {
        (*(pMVar13->
          super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
          ).super_MessageLite._vptr_MessageLite[1])(pMVar13);
      }
      if (local_68.array_ !=
          (MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
           **)0x0) {
        operator_delete__(local_68.array_);
      }
    }
  }
  return;
}

Assistant:

void Block::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.MILSpec.Block)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.MILSpec.NamedValueType inputs = 1;
  for (unsigned int i = 0, n = this->inputs_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, this->inputs(i), output);
  }

  // repeated string outputs = 2;
  for (int i = 0, n = this->outputs_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->outputs(i).data(), this->outputs(i).length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.MILSpec.Block.outputs");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      2, this->outputs(i), output);
  }

  // repeated .CoreML.Specification.MILSpec.Operation operations = 3;
  for (unsigned int i = 0, n = this->operations_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, this->operations(i), output);
  }

  // map<string, .CoreML.Specification.MILSpec.Value> attributes = 4;
  if (!this->attributes().empty()) {
    typedef ::google::protobuf::Map< ::std::string, ::CoreML::Specification::MILSpec::Value >::const_pointer
        ConstPtr;
    typedef ConstPtr SortItem;
    typedef ::google::protobuf::internal::CompareByDerefFirst<SortItem> Less;
    struct Utf8Check {
      static void Check(ConstPtr p) {
        ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          p->first.data(), p->first.length(),
          ::google::protobuf::internal::WireFormatLite::SERIALIZE,
          "CoreML.Specification.MILSpec.Block.AttributesEntry.key");
      }
    };

    if (output->IsSerializationDeterministic() &&
        this->attributes().size() > 1) {
      ::google::protobuf::scoped_array<SortItem> items(
          new SortItem[this->attributes().size()]);
      typedef ::google::protobuf::Map< ::std::string, ::CoreML::Specification::MILSpec::Value >::size_type size_type;
      size_type n = 0;
      for (::google::protobuf::Map< ::std::string, ::CoreML::Specification::MILSpec::Value >::const_iterator
          it = this->attributes().begin();
          it != this->attributes().end(); ++it, ++n) {
        items[n] = SortItem(&*it);
      }
      ::std::sort(&items[0], &items[n], Less());
      ::google::protobuf::scoped_ptr<Block_AttributesEntry> entry;
      for (size_type i = 0; i < n; i++) {
        entry.reset(attributes_.NewEntryWrapper(
            items[i]->first, items[i]->second));
        ::google::protobuf::internal::WireFormatLite::WriteMessage(
            4, *entry, output);
        Utf8Check::Check(items[i]);
      }
    } else {
      ::google::protobuf::scoped_ptr<Block_AttributesEntry> entry;
      for (::google::protobuf::Map< ::std::string, ::CoreML::Specification::MILSpec::Value >::const_iterator
          it = this->attributes().begin();
          it != this->attributes().end(); ++it) {
        entry.reset(attributes_.NewEntryWrapper(
            it->first, it->second));
        ::google::protobuf::internal::WireFormatLite::WriteMessage(
            4, *entry, output);
        Utf8Check::Check(&*it);
      }
    }
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.MILSpec.Block)
}